

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator
          (cmGhsMultiTargetGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  cmLocalGenerator *pcVar2;
  cmMakefile *pcVar3;
  string *psVar4;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue config;
  cmGeneratorTarget *target_local;
  cmGhsMultiTargetGenerator *this_local;
  
  this->_vptr_cmGhsMultiTargetGenerator = (_func_int **)&PTR__cmGhsMultiTargetGenerator_01107d90;
  this->GeneratorTarget = target;
  pcVar2 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = (cmLocalGhsMultiGenerator *)pcVar2;
  pcVar3 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar3;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->FlagsByLanguage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->DefinesByLanguage);
  std::__cxx11::string::string((string *)&this->TargetNameReal);
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::string((string *)&this->Name,(string *)psVar4);
  std::__cxx11::string::string((string *)&this->ConfigName);
  pcVar3 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_BUILD_TYPE",&local_51);
  local_30 = cmMakefile::GetDefinition(pcVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_30);
    std::__cxx11::string::operator=((string *)&this->ConfigName,(string *)psVar4);
  }
  else {
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator(cmGeneratorTarget* target)
  : GeneratorTarget(target)
  , LocalGenerator(
      static_cast<cmLocalGhsMultiGenerator*>(target->GetLocalGenerator()))
  , Makefile(target->Target->GetMakefile())
  , Name(target->GetName())
{
  // Store the configuration name that is being used
  if (cmValue config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE")) {
    // Use the build type given by the user.
    this->ConfigName = *config;
  } else {
    // No configuration type given.
    this->ConfigName.clear();
  }
}